

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O0

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  char cVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  ulong uVar6;
  char *pcVar7;
  uint *puVar8;
  uint Result;
  uint local_198;
  uint local_194;
  ulong uStack_190;
  int OldRow;
  size_type x;
  uint Previous;
  uint BestThisRow;
  size_type y;
  uint i;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *local_168;
  uint *Row;
  unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> Allocated;
  uint SmallBuffer [64];
  uint SmallBufferSize;
  size_type n;
  size_type m;
  uint MaxEditDistance_local;
  bool AllowReplacements_local;
  ArrayRef<char> ToArray_local;
  ArrayRef<char> FromArray_local;
  
  ToArray_local.Data = (char *)ToArray.Length;
  _MaxEditDistance_local = ToArray.Data;
  ToArray_local.Length = (size_type)FromArray.Data;
  sVar4 = ArrayRef<char>::size((ArrayRef<char> *)&ToArray_local.Length);
  sVar5 = ArrayRef<char>::size((ArrayRef<char> *)&MaxEditDistance_local);
  std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::
  unique_ptr<std::default_delete<unsigned_int[]>,void>
            ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&Row);
  local_168 = &Allocated;
  if (0x40 < sVar5 + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar5 + 1;
    uVar6 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    local_168 = (unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)
                operator_new__(uVar6);
    std::unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>>::reset<unsigned_int*,void>
              ((unique_ptr<unsigned_int[],std::default_delete<unsigned_int[]>> *)&Row,
               (uint *)local_168);
  }
  for (y._0_4_ = 1; (uint)y <= sVar5; y._0_4_ = (uint)y + 1) {
    *(uint *)((long)&(local_168->_M_t).
                     super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                     super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
                     super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + (ulong)(uint)y * 4)
         = (uint)y;
  }
  _Previous = 1;
  do {
    if (sVar4 < _Previous) {
      FromArray_local.Length._4_4_ =
           *(uint *)((long)&(local_168->_M_t).
                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                            .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + sVar5 * 4);
LAB_0289d3fc:
      std::unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>::~unique_ptr
                ((unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_> *)&Row);
      return FromArray_local.Length._4_4_;
    }
    *(uint *)&(local_168->_M_t).
              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
              super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl = (uint)_Previous;
    x._4_4_ = *(uint *)&(local_168->_M_t).
                        super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                        .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl;
    x._0_4_ = (uint)_Previous - 1;
    for (uStack_190 = 1; uVar3 = (uint)x, uStack_190 <= sVar5; uStack_190 = uStack_190 + 1) {
      local_194 = *(uint *)((long)&(local_168->_M_t).
                                   super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                   .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                           uStack_190 * 4);
      if (AllowReplacements) {
        pcVar7 = ArrayRef<char>::operator[]((ArrayRef<char> *)&ToArray_local.Length,_Previous - 1);
        cVar1 = *pcVar7;
        pcVar7 = ArrayRef<char>::operator[]((ArrayRef<char> *)&MaxEditDistance_local,uStack_190 - 1)
        ;
        local_198 = uVar3 + (cVar1 != *pcVar7);
        puVar8 = std::min<unsigned_int>
                           ((uint *)((long)local_168 + uStack_190 * 4 + -4),
                            (uint *)((long)&(local_168->_M_t).
                                            super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                            .super__Head_base<0UL,_unsigned_int_*,_false>.
                                            _M_head_impl + uStack_190 * 4));
        Result = *puVar8 + 1;
        puVar8 = std::min<unsigned_int>(&local_198,&Result);
        *(uint *)((long)&(local_168->_M_t).
                         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                         .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + uStack_190 * 4
                 ) = *puVar8;
      }
      else {
        pcVar7 = ArrayRef<char>::operator[]((ArrayRef<char> *)&ToArray_local.Length,_Previous - 1);
        cVar1 = *pcVar7;
        pcVar7 = ArrayRef<char>::operator[]((ArrayRef<char> *)&MaxEditDistance_local,uStack_190 - 1)
        ;
        if (cVar1 == *pcVar7) {
          *(uint *)((long)&(local_168->_M_t).
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                   uStack_190 * 4) = (uint)x;
        }
        else {
          puVar8 = std::min<unsigned_int>
                             ((uint *)((long)local_168 + uStack_190 * 4 + -4),
                              (uint *)((long)&(local_168->_M_t).
                                              super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                              .super__Head_base<0UL,_unsigned_int_*,_false>.
                                              _M_head_impl + uStack_190 * 4));
          *(uint *)((long)&(local_168->_M_t).
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl +
                   uStack_190 * 4) = *puVar8 + 1;
        }
      }
      x._0_4_ = local_194;
      puVar8 = std::min<unsigned_int>
                         ((uint *)((long)&x + 4),
                          (uint *)((long)&(local_168->_M_t).
                                          super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                                          .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                                  + uStack_190 * 4));
      x._4_4_ = *puVar8;
    }
    if ((MaxEditDistance != 0) && (MaxEditDistance < x._4_4_)) {
      FromArray_local.Length._4_4_ = MaxEditDistance + 1;
      goto LAB_0289d3fc;
    }
    _Previous = _Previous + 1;
  } while( true );
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}